

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

int __thiscall gl4cts::RobustnessTests::init(RobustnessTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"noResetNotification",
             "Verifies if NO_RESET_NOTIFICATION strategy works as expected.");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c81d0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"loseContextOnReset",
             "Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected.");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c8238;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"getnuniform",
             "Verifies if read uniform variables to the buffer with bufSize less than expected result with GL_INVALID_OPERATION"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c80e0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"readnpixels",
             "Verifies if read pixels to the buffer with bufSize less than expected result with GL_INVALID_OPERATION error"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c8118;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void RobustnessTests::init()
{
	deqp::TestCaseGroup::init();

	try
	{
		addChild(new ResetNotificationStrategy::NoResetNotificationCase(
			m_context, "noResetNotification", "Verifies if NO_RESET_NOTIFICATION strategy works as expected."));
		addChild(new ResetNotificationStrategy::LoseContextOnResetCase(
			m_context, "loseContextOnReset", "Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected."));

		addChild(new RobustnessRobustBufferAccessBehavior::GetnUniformTest(m_context));
		addChild(new RobustnessRobustBufferAccessBehavior::ReadnPixelsTest(m_context));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestCaseGroup::deinit();
		throw;
	}
}